

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

double max_diff(vec *a,vec *b)

{
  pointer pdVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  pdVar1 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar2 = (long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar2 != 0) {
    uVar3 = 0;
    dVar5 = 0.0;
    do {
      dVar4 = ABS(pdVar1[uVar3] -
                  (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar3]);
      if (dVar4 <= dVar5) {
        dVar4 = dVar5;
      }
      uVar3 = uVar3 + 1;
      dVar5 = dVar4;
    } while ((uVar3 & 0xffffffff) < (ulong)(lVar2 >> 3));
    return dVar4;
  }
  return 0.0;
}

Assistant:

double max_diff(const vec& a, const vec& b)
{
    double max_diff = 0.0;
    for (unsigned int i = 0; i < a.size(); i++)
    {
        double diff = std::abs(a[i] - b[i]);
        if (diff > max_diff)
        {
            max_diff = diff;
        }
    }

    return max_diff;
}